

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

void __thiscall tcu::anon_unknown_4::TestBinary32::runTest(TestBinary32 *this)

{
  deBool dVar1;
  FloatFormat *pFVar2;
  TestError *pTVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  bool local_239;
  bool local_211;
  bool local_1e9;
  bool local_1b9;
  bool local_191;
  string local_e0;
  byte local_b9;
  string local_b8;
  byte local_91;
  string local_90;
  byte local_69;
  string local_68;
  byte local_31;
  string local_30;
  TestBinary32 *local_10;
  TestBinary32 *this_local;
  
  local_10 = this;
  dVar4 = Test::p(&this->super_Test,0);
  dVar5 = Test::p(&this->super_Test,-0x18);
  Test::testULP(&this->super_Test,dVar4,dVar5);
  dVar4 = Test::p(&this->super_Test,0);
  dVar5 = Test::p(&this->super_Test,-0x17);
  dVar6 = Test::p(&this->super_Test,-0x17);
  Test::testULP(&this->super_Test,dVar4 + dVar5,dVar6);
  dVar4 = Test::p(&this->super_Test,-0x7c);
  dVar5 = Test::p(&this->super_Test,-0x94);
  Test::testULP(&this->super_Test,dVar4,dVar5);
  dVar4 = Test::p(&this->super_Test,-0x7d);
  dVar5 = Test::p(&this->super_Test,-0x95);
  Test::testULP(&this->super_Test,dVar4,dVar5);
  dVar4 = Test::p(&this->super_Test,-0x7d);
  dVar5 = Test::p(&this->super_Test,-0x8c);
  dVar6 = Test::p(&this->super_Test,-0x94);
  Test::testULP(&this->super_Test,dVar4 + dVar5,dVar6);
  dVar4 = Test::p(&this->super_Test,-0x7e);
  dVar5 = Test::p(&this->super_Test,-0x95);
  Test::testULP(&this->super_Test,dVar4,dVar5);
  dVar4 = Test::p(&this->super_Test,-0x82);
  dVar5 = Test::p(&this->super_Test,-0x95);
  Test::testULP(&this->super_Test,dVar4,dVar5);
  dVar4 = Test::p(&this->super_Test,0);
  dVar5 = Test::p(&this->super_Test,-0x14);
  dVar6 = Test::p(&this->super_Test,-0x28);
  dVar7 = Test::p(&this->super_Test,0);
  dVar8 = Test::p(&this->super_Test,-0x14);
  dVar9 = Test::p(&this->super_Test,0);
  dVar10 = Test::p(&this->super_Test,-0x14);
  dVar11 = Test::p(&this->super_Test,-0x17);
  Test::testRound(&this->super_Test,dVar4 + dVar5 + dVar6,dVar7 + dVar8,dVar9 + dVar10 + dVar11);
  dVar4 = Test::p(&this->super_Test,-0x7e);
  dVar5 = Test::p(&this->super_Test,-0x96);
  dVar6 = Test::p(&this->super_Test,-0x7e);
  dVar7 = Test::p(&this->super_Test,-0x95);
  dVar8 = Test::p(&this->super_Test,-0x7e);
  Test::testRound(&this->super_Test,dVar4 - dVar5,dVar6 - dVar7,dVar8);
  while( true ) {
    dVar1 = ::deGetFalse();
    local_31 = 0;
    local_191 = false;
    if (dVar1 == 0) {
      pFVar2 = de::details::UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>::
               operator->((UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_> *)
                          this);
      dVar4 = Test::p(&this->super_Test,0);
      FloatFormat::floatToHex_abi_cxx11_(&local_30,pFVar2,dVar4);
      local_31 = 1;
      local_191 = std::operator==(&local_30,"0x1.000000p0");
    }
    if ((local_31 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_30);
    }
    if (((local_191 ^ 0xffU) & 1) != 0) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      while( true ) {
        dVar1 = ::deGetFalse();
        local_69 = 0;
        local_1b9 = false;
        if (dVar1 == 0) {
          pFVar2 = de::details::UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>
                   ::operator->((UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>
                                 *)this);
          dVar4 = Test::p(&this->super_Test,8);
          dVar5 = Test::p(&this->super_Test,-4);
          FloatFormat::floatToHex_abi_cxx11_(&local_68,pFVar2,dVar4 + dVar5);
          local_69 = 1;
          local_1b9 = std::operator==(&local_68,"0x1.001000p8");
        }
        if ((local_69 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_68);
        }
        if (((local_1b9 ^ 0xffU) & 1) != 0) break;
        dVar1 = ::deGetFalse();
        if (dVar1 == 0) {
          while( true ) {
            dVar1 = ::deGetFalse();
            local_91 = 0;
            local_1e9 = false;
            if (dVar1 == 0) {
              pFVar2 = de::details::
                       UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>::
                       operator->((UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>
                                   *)this);
              dVar4 = Test::p(&this->super_Test,-0x8c);
              FloatFormat::floatToHex_abi_cxx11_(&local_90,pFVar2,dVar4);
              local_91 = 1;
              local_1e9 = std::operator==(&local_90,"0x0.000400p-126");
            }
            if ((local_91 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_90);
            }
            if (((local_1e9 ^ 0xffU) & 1) != 0) break;
            dVar1 = ::deGetFalse();
            if (dVar1 == 0) {
              while( true ) {
                dVar1 = ::deGetFalse();
                local_b9 = 0;
                local_211 = false;
                if (dVar1 == 0) {
                  pFVar2 = de::details::
                           UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>::
                           operator->((UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>
                                       *)this);
                  dVar4 = Test::p(&this->super_Test,-0x8c);
                  FloatFormat::floatToHex_abi_cxx11_(&local_b8,pFVar2,dVar4);
                  local_b9 = 1;
                  local_211 = std::operator==(&local_b8,"0x0.000400p-126");
                }
                if ((local_b9 & 1) != 0) {
                  std::__cxx11::string::~string((string *)&local_b8);
                }
                if (((local_211 ^ 0xffU) & 1) != 0) break;
                dVar1 = ::deGetFalse();
                if (dVar1 == 0) {
                  while( true ) {
                    dVar1 = ::deGetFalse();
                    local_239 = false;
                    if (dVar1 == 0) {
                      pFVar2 = de::details::
                               UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>::
                               operator->((UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>
                                           *)this);
                      dVar4 = Test::p(&this->super_Test,-0x7e);
                      dVar5 = Test::p(&this->super_Test,-0x7d);
                      FloatFormat::floatToHex_abi_cxx11_(&local_e0,pFVar2,dVar4 + dVar5);
                      local_239 = std::operator==(&local_e0,"0x1.800000p-125");
                    }
                    if (dVar1 == 0) {
                      std::__cxx11::string::~string((string *)&local_e0);
                    }
                    if (((local_239 ^ 0xffU) & 1) != 0) break;
                    dVar1 = ::deGetFalse();
                    if (dVar1 == 0) {
                      return;
                    }
                  }
                  pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
                  TestError::TestError
                            (pTVar3,(char *)0x0,
                             "m_fmt->floatToHex(p(-126) + p(-125)) == \"0x1.800000p-125\"",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
                             ,0x17b);
                  __cxa_throw(pTVar3,&TestError::typeinfo,TestError::~TestError);
                }
              }
              pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
              TestError::TestError
                        (pTVar3,(char *)0x0,"m_fmt->floatToHex(p(-140)) == \"0x0.000400p-126\"",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
                         ,0x17a);
              __cxa_throw(pTVar3,&TestError::typeinfo,TestError::~TestError);
            }
          }
          pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
          TestError::TestError
                    (pTVar3,(char *)0x0,"m_fmt->floatToHex(p(-140)) == \"0x0.000400p-126\"",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
                     ,0x179);
          __cxa_throw(pTVar3,&TestError::typeinfo,TestError::~TestError);
        }
      }
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      TestError::TestError
                (pTVar3,(char *)0x0,"m_fmt->floatToHex(p(8) + p(-4)) == \"0x1.001000p8\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
                 ,0x178);
      __cxa_throw(pTVar3,&TestError::typeinfo,TestError::~TestError);
    }
  }
  pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
  TestError::TestError
            (pTVar3,(char *)0x0,"m_fmt->floatToHex(p(0)) == \"0x1.000000p0\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
             ,0x177);
  __cxa_throw(pTVar3,&TestError::typeinfo,TestError::~TestError);
}

Assistant:

void TestBinary32::runTest (void) const
{
	testULP(p(0),				p(-24));
	testULP(p(0) + p(-23),		p(-23));
	testULP(p(-124),			p(-148));
	testULP(p(-125),			p(-149));
	testULP(p(-125) + p(-140),	p(-148));
	testULP(p(-126),			p(-149));
	testULP(p(-130),			p(-149));

	testRound(p(0) + p(-20) + p(-40),	p(0) + p(-20),		p(0) + p(-20) + p(-23));
	testRound(p(-126) - p(-150),		p(-126) - p(-149),	p(-126));

	TCU_CHECK(m_fmt->floatToHex(p(0)) == "0x1.000000p0");
	TCU_CHECK(m_fmt->floatToHex(p(8) + p(-4)) == "0x1.001000p8");
	TCU_CHECK(m_fmt->floatToHex(p(-140)) == "0x0.000400p-126");
	TCU_CHECK(m_fmt->floatToHex(p(-140)) == "0x0.000400p-126");
	TCU_CHECK(m_fmt->floatToHex(p(-126) + p(-125)) == "0x1.800000p-125");
}